

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::ComputeOutputDir
          (cmGeneratorTarget *this,string *config,ArtifactType artifact,string *out)

{
  cmLocalGenerator *pcVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  TargetType TVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  string *psVar8;
  cmGlobalGenerator *pcVar9;
  byte local_432;
  allocator<char> local_371;
  string local_370 [39];
  allocator<char> local_349;
  string local_348 [8];
  string suffix;
  undefined1 local_320 [7];
  bool useEPN;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  cmValue local_250;
  cmValue outdir;
  string local_228;
  string local_208;
  cmValue local_1e8;
  cmValue config_outdir;
  cmAlphaNum local_1b0;
  string local_180;
  undefined1 local_160 [8];
  string configProp;
  string configUpper;
  cmAlphaNum local_f0;
  string local_c0;
  undefined1 local_a0 [8];
  string propertyName;
  undefined1 local_70 [8];
  string targetTypeName;
  string conf;
  bool usesDefaultOutputDir;
  string *out_local;
  ArtifactType artifact_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  std::__cxx11::string::string((string *)(targetTypeName.field_2._M_local_buf + 8),(string *)config)
  ;
  pcVar6 = GetOutputTargetType(this,artifact);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,pcVar6,(allocator<char> *)(propertyName.field_2._M_local_buf + 0xb))
  ;
  std::allocator<char>::~allocator((allocator<char> *)(propertyName.field_2._M_local_buf + 0xb));
  std::__cxx11::string::string((string *)local_a0);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    cmAlphaNum::cmAlphaNum(&local_f0,(string *)local_70);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&configUpper.field_2 + 8),"_OUTPUT_DIRECTORY");
    cmStrCat<>(&local_c0,&local_f0,(cmAlphaNum *)((long)&configUpper.field_2 + 8));
    std::__cxx11::string::operator=((string *)local_a0,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  cmsys::SystemTools::UpperCase
            ((string *)((long)&configProp.field_2 + 8),(string *)((long)&targetTypeName.field_2 + 8)
            );
  std::__cxx11::string::string((string *)local_160);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    cmAlphaNum::cmAlphaNum(&local_1b0,(string *)local_70);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&config_outdir,"_OUTPUT_DIRECTORY_");
    cmStrCat<std::__cxx11::string>
              (&local_180,&local_1b0,(cmAlphaNum *)&config_outdir,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&configProp.field_2 + 8));
    std::__cxx11::string::operator=((string *)local_160,(string *)&local_180);
    std::__cxx11::string::~string((string *)&local_180);
  }
  local_1e8 = GetProperty(this,(string *)local_160);
  bVar3 = cmValue::operator_cast_to_bool(&local_1e8);
  if (bVar3) {
    psVar8 = cmValue::operator*[abi_cxx11_(&local_1e8);
    std::__cxx11::string::string((string *)&local_228,(string *)psVar8);
    pcVar1 = this->LocalGenerator;
    std::__cxx11::string::string((string *)&outdir);
    cmGeneratorExpression::Evaluate
              (&local_208,&local_228,pcVar1,config,this,(cmGeneratorExpressionDAGChecker *)0x0,
               (cmGeneratorTarget *)0x0,(string *)&outdir);
    std::__cxx11::string::operator=((string *)out,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&outdir);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::clear();
  }
  else {
    local_250 = GetProperty(this,(string *)local_a0);
    bVar3 = cmValue::operator_cast_to_bool(&local_250);
    if (bVar3) {
      psVar8 = cmValue::operator*[abi_cxx11_(&local_250);
      std::__cxx11::string::string((string *)&local_290,(string *)psVar8);
      pcVar1 = this->LocalGenerator;
      std::__cxx11::string::string((string *)&local_2b0);
      cmGeneratorExpression::Evaluate
                (&local_270,&local_290,pcVar1,config,this,(cmGeneratorExpressionDAGChecker *)0x0,
                 (cmGeneratorTarget *)0x0,&local_2b0);
      std::__cxx11::string::operator=((string *)out,(string *)&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_290);
      psVar8 = cmValue::operator*[abi_cxx11_(&local_250);
      bVar3 = std::operator!=(out,psVar8);
      if (bVar3) {
        std::__cxx11::string::clear();
      }
    }
    else {
      TVar4 = GetType(this);
      if (TVar4 == EXECUTABLE) {
        pcVar2 = this->Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2d0,"EXECUTABLE_OUTPUT_PATH",&local_2d1);
        psVar8 = cmMakefile::GetSafeDefinition(pcVar2,&local_2d0);
        std::__cxx11::string::operator=((string *)out,(string *)psVar8);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::allocator<char>::~allocator(&local_2d1);
      }
      else {
        TVar4 = GetType(this);
        if (((TVar4 == STATIC_LIBRARY) || (TVar4 = GetType(this), TVar4 == SHARED_LIBRARY)) ||
           (TVar4 = GetType(this), TVar4 == MODULE_LIBRARY)) {
          pcVar2 = this->Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2f8,"LIBRARY_OUTPUT_PATH",&local_2f9);
          psVar8 = cmMakefile::GetSafeDefinition(pcVar2,&local_2f8);
          std::__cxx11::string::operator=((string *)out,(string *)psVar8);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::allocator<char>::~allocator(&local_2f9);
        }
      }
    }
  }
  uVar7 = std::__cxx11::string::empty();
  bVar3 = (uVar7 & 1) != 0;
  if (bVar3) {
    std::__cxx11::string::operator=((string *)out,".");
  }
  psVar8 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
  cmsys::SystemTools::CollapseFullPath((string *)local_320,out,psVar8);
  std::__cxx11::string::operator=((string *)out,(string *)local_320);
  std::__cxx11::string::~string((string *)local_320);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    iVar5 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x2f])
                      (this->GlobalGenerator,this->Makefile);
    suffix.field_2._M_local_buf[0xf] = (byte)iVar5 & 1;
    local_432 = 0;
    if (bVar3) {
      local_432 = suffix.field_2._M_local_buf[0xf];
    }
    pcVar6 = "";
    if (local_432 != 0) {
      pcVar6 = "${EFFECTIVE_PLATFORM_NAME}";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_348,pcVar6,&local_349);
    std::allocator<char>::~allocator(&local_349);
    pcVar9 = cmLocalGenerator::GetGlobalGenerator(this->LocalGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_370,"/",&local_371);
    (*pcVar9->_vptr_cmGlobalGenerator[0x18])
              (pcVar9,local_370,(undefined1 *)((long)&targetTypeName.field_2 + 8),local_348,out);
    std::__cxx11::string::~string(local_370);
    std::allocator<char>::~allocator(&local_371);
    std::__cxx11::string::~string(local_348);
  }
  std::__cxx11::string::~string((string *)local_160);
  std::__cxx11::string::~string((string *)(configProp.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(targetTypeName.field_2._M_local_buf + 8));
  return bVar3;
}

Assistant:

bool cmGeneratorTarget::ComputeOutputDir(const std::string& config,
                                         cmStateEnums::ArtifactType artifact,
                                         std::string& out) const
{
  bool usesDefaultOutputDir = false;
  std::string conf = config;

  // Look for a target property defining the target output directory
  // based on the target type.
  std::string targetTypeName = this->GetOutputTargetType(artifact);
  std::string propertyName;
  if (!targetTypeName.empty()) {
    propertyName = cmStrCat(targetTypeName, "_OUTPUT_DIRECTORY");
  }

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(conf);
  std::string configProp;
  if (!targetTypeName.empty()) {
    configProp = cmStrCat(targetTypeName, "_OUTPUT_DIRECTORY_", configUpper);
  }

  // Select an output directory.
  if (cmValue config_outdir = this->GetProperty(configProp)) {
    // Use the user-specified per-configuration output directory.
    out = cmGeneratorExpression::Evaluate(*config_outdir, this->LocalGenerator,
                                          config, this);

    // Skip per-configuration subdirectory.
    conf.clear();
  } else if (cmValue outdir = this->GetProperty(propertyName)) {
    // Use the user-specified output directory.
    out = cmGeneratorExpression::Evaluate(*outdir, this->LocalGenerator,
                                          config, this);
    // Skip per-configuration subdirectory if the value contained a
    // generator expression.
    if (out != *outdir) {
      conf.clear();
    }
  } else if (this->GetType() == cmStateEnums::EXECUTABLE) {
    // Lookup the output path for executables.
    out = this->Makefile->GetSafeDefinition("EXECUTABLE_OUTPUT_PATH");
  } else if (this->GetType() == cmStateEnums::STATIC_LIBRARY ||
             this->GetType() == cmStateEnums::SHARED_LIBRARY ||
             this->GetType() == cmStateEnums::MODULE_LIBRARY) {
    // Lookup the output path for libraries.
    out = this->Makefile->GetSafeDefinition("LIBRARY_OUTPUT_PATH");
  }
  if (out.empty()) {
    // Default to the current output directory.
    usesDefaultOutputDir = true;
    out = ".";
  }

  // Convert the output path to a full path in case it is
  // specified as a relative path.  Treat a relative path as
  // relative to the current output directory for this makefile.
  out = (cmSystemTools::CollapseFullPath(
    out, this->LocalGenerator->GetCurrentBinaryDirectory()));

  // The generator may add the configuration's subdirectory.
  if (!conf.empty()) {
    bool useEPN =
      this->GlobalGenerator->UseEffectivePlatformName(this->Makefile);
    std::string suffix =
      usesDefaultOutputDir && useEPN ? "${EFFECTIVE_PLATFORM_NAME}" : "";
    this->LocalGenerator->GetGlobalGenerator()->AppendDirectoryForConfig(
      "/", conf, suffix, out);
  }

  return usesDefaultOutputDir;
}